

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirDISP(void)

{
  bool bVar1;
  int iVar2;
  int local_10;
  uint local_c;
  aint valPageNum;
  aint valAdr;
  
  if (PseudoORG == DISP_NONE) {
    Relocation::isResultAffected = 0;
    iVar2 = ParseExpressionNoSyntaxError(&lp,(aint *)&local_c);
    if (iVar2 == 0) {
      Error("[DISP] Syntax error in <address>",lp,SUPPRESS);
    }
    else {
      bVar1 = Relocation::checkAndWarn(true);
      if (bVar1) {
        SkipToEol(&lp);
      }
      else {
        bVar1 = comma(&lp);
        if (bVar1) {
          iVar2 = ParseExpressionNoSyntaxError(&lp,&local_10);
          if (iVar2 == 0) {
            Error("[DISP] Syntax error in <page number>",lp,PASS3);
            return;
          }
          if (DeviceID == (char *)0x0) {
            Error("[DISP] <page number> is accepted only in device mode",line,PASS3);
            return;
          }
          if ((local_10 < 0) || (Device->PagesCount <= local_10)) {
            ErrorInt("[DISP] <page number> is out of range",local_10,PASS3);
            return;
          }
          dispPageNum = local_10;
        }
        else {
          dispPageNum = -1;
        }
        if (((DeviceID != (char *)0x0) || ((Options::IsLongPtr & 1) == 0)) &&
           (iVar2 = check16u(local_c), iVar2 == 0)) {
          local_c = local_c & 0xffff;
        }
        adrdisp = CurAddress;
        CurAddress = local_c;
        PseudoORG = DISP_ACTIVE;
        if (Relocation::type != 0) {
          PseudoORG = DISP_INSIDE_RELOCATE;
        }
      }
    }
  }
  else {
    Warning("[DISP] displacement inside another displacement block, ignoring it.",(char *)0x0,
            W_PASS3);
    SkipToEol(&lp);
  }
  return;
}

Assistant:

static void dirDISP() {
	if (DISP_NONE != PseudoORG) {
		Warning("[DISP] displacement inside another displacement block, ignoring it.");
		SkipToEol(lp);
		return;
	}
	aint valAdr, valPageNum;
	// parse+validate values first, don't even switch into DISP mode in case of any error
	Relocation::isResultAffected = false;
	if (!ParseExpressionNoSyntaxError(lp, valAdr)) {
		Error("[DISP] Syntax error in <address>", lp, SUPPRESS);
		return;
	}
	// the expression of the DISP shouldn't be affected by relocation (even when starting inside relocation block)
	if (Relocation::checkAndWarn(true)) {
		SkipToEol(lp);
		return;		// report it as error and exit early
	}
	if (comma(lp)) {
		if (!ParseExpressionNoSyntaxError(lp, valPageNum)) {
			Error("[DISP] Syntax error in <page number>", lp);
			return;
		}
		if (!DeviceID) {
			Error("[DISP] <page number> is accepted only in device mode", line);
			return;
		}
		if (valPageNum < 0 || Device->PagesCount <= valPageNum) {
			ErrorInt("[DISP] <page number> is out of range", valPageNum);
			return;
		}
		dispPageNum = valPageNum;
	} else {
		dispPageNum = LABEL_PAGE_UNDEFINED;
	}
	// crop (with warning) address in device or non-longptr mode to 16bit address range
	if ((DeviceID || !Options::IsLongPtr) && !check16u(valAdr)) valAdr &= 0xFFFF;
	// everything is valid, switch to DISP mode (dispPageNum is already set above)
	adrdisp = CurAddress;
	CurAddress = valAdr;
	PseudoORG = Relocation::type ? DISP_INSIDE_RELOCATE : DISP_ACTIVE;
}